

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HaveBuildTreeRPATH(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  cmLinkImplementationLibraries *this_00;
  cmLinkImplementationLibraries *impl;
  undefined1 local_78 [8];
  string build_rpath;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"SKIP_BUILD_RPATH",&local_41);
  bVar1 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)local_78);
    bVar1 = GetBuildRPATH(this,local_20,(string *)local_78);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      this_00 = GetLinkImplementationLibraries(this,local_20,Link);
      if (this_00 == (cmLinkImplementationLibraries *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        bVar1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::empty
                          (&this_00->Libraries);
        this_local._7_1_ = (bVar1 ^ 0xffU) & 1;
      }
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH")) {
    return false;
  }
  std::string build_rpath;
  if (this->GetBuildRPATH(config, build_rpath)) {
    return true;
  }
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibraries(config, LinkInterfaceFor::Link)) {
    return !impl->Libraries.empty();
  }
  return false;
}